

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O0

int set_file_offset(stb_vorbis *f,uint loc)

{
  long lVar1;
  uint in_ESI;
  long in_RDI;
  undefined4 local_14;
  undefined4 local_4;
  
  *(undefined4 *)(in_RDI + 0x98) = 0;
  if (*(long *)(in_RDI + 0x40) == 0) {
    if ((in_ESI + *(int *)(in_RDI + 0x38) < in_ESI) || (0x7fffffff < in_ESI)) {
      local_14 = 0x7fffffff;
      *(undefined4 *)(in_RDI + 0x98) = 1;
    }
    else {
      local_14 = *(int *)(in_RDI + 0x38) + in_ESI;
    }
    lVar1 = (**(code **)(*(long *)(in_RDI + 0x30) + 0x10))
                      (**(undefined8 **)(in_RDI + 0x30),local_14,0);
    if (lVar1 == -1) {
      *(undefined4 *)(in_RDI + 0x98) = 1;
      (**(code **)(*(long *)(in_RDI + 0x30) + 0x10))
                (**(undefined8 **)(in_RDI + 0x30),*(undefined4 *)(in_RDI + 0x38),2);
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  else if ((*(long *)(in_RDI + 0x48) + (ulong)in_ESI < *(ulong *)(in_RDI + 0x50)) &&
          (*(ulong *)(in_RDI + 0x48) <= *(long *)(in_RDI + 0x48) + (ulong)in_ESI)) {
    *(ulong *)(in_RDI + 0x40) = *(long *)(in_RDI + 0x48) + (ulong)in_ESI;
    local_4 = 1;
  }
  else {
    *(undefined8 *)(in_RDI + 0x40) = *(undefined8 *)(in_RDI + 0x50);
    *(undefined4 *)(in_RDI + 0x98) = 1;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int set_file_offset(stb_vorbis *f, unsigned int loc)
{
   #ifndef STB_VORBIS_NO_PUSHDATA_API
   if (f->push_mode) return 0;
   #endif
   f->eof = 0;
   if (USE_MEMORY(f)) {
      if (f->stream_start + loc >= f->stream_end || f->stream_start + loc < f->stream_start) {
         f->stream = f->stream_end;
         f->eof = 1;
         return 0;
      } else {
         f->stream = f->stream_start + loc;
         return 1;
      }
   }
   #ifndef STB_VORBIS_NO_STDIO
   if (loc + f->f_start < loc || loc >= 0x80000000) {
      loc = 0x7fffffff;
      f->eof = 1;
   } else {
      loc += f->f_start;
   }
   if (fseek(f->f, loc, SEEK_SET) != -1) /* FAudio change! */
      return 1;
   f->eof = 1;
   fseek(f->f, f->f_start, SEEK_END);
   return 0;
   #endif
}